

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_source(SOURCE_HANDLE source)

{
  SOURCE_INSTANCE *source_instance;
  AMQP_VALUE result;
  SOURCE_HANDLE source_local;
  
  if (source == (SOURCE_HANDLE)0x0) {
    source_instance = (SOURCE_INSTANCE *)0x0;
  }
  else {
    source_instance = (SOURCE_INSTANCE *)amqpvalue_clone(source->composite_value);
  }
  return (AMQP_VALUE)source_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_source(SOURCE_HANDLE source)
{
    AMQP_VALUE result;

    if (source == NULL)
    {
        result = NULL;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        result = amqpvalue_clone(source_instance->composite_value);
    }

    return result;
}